

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O3

void pzgeom::TPZGeoQuad::ComputeNormal
               (TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3,TPZVec<double> *result)

{
  double *pdVar1;
  double *pdVar2;
  TPZVec<double> normal;
  TPZVec<double> v1;
  TPZVec<double> v2;
  TPZVec<double> local_80;
  TPZVec<double> local_60;
  TPZVec<double> local_40;
  
  TPZVec<double>::TPZVec(&local_60,3);
  TPZVec<double>::TPZVec(&local_40,3);
  TPZVec<double>::TPZVec(&local_80,3);
  pdVar1 = p1->fStore;
  pdVar2 = p2->fStore;
  *local_60.fStore = *pdVar1 - *pdVar2;
  local_60.fStore[1] = pdVar1[1] - pdVar2[1];
  local_60.fStore[2] = pdVar1[2] - pdVar2[2];
  pdVar1 = p3->fStore;
  *local_40.fStore = *pdVar2 - *pdVar1;
  local_40.fStore[1] = pdVar2[1] - pdVar1[1];
  local_40.fStore[2] = pdVar2[2] - pdVar1[2];
  VectorialProduct(&local_60,&local_40,&local_80);
  VectorialProduct(&local_60,&local_80,result);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_80.fStore != (double *)0x0) {
    operator_delete__(local_80.fStore);
  }
  local_40._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_40.fStore != (double *)0x0) {
    operator_delete__(local_40.fStore);
  }
  local_60._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_60.fStore != (double *)0x0) {
    operator_delete__(local_60.fStore);
  }
  return;
}

Assistant:

void TPZGeoQuad::ComputeNormal(TPZVec<REAL> &p1, TPZVec<REAL> &p2,TPZVec<REAL> &p3,TPZVec<REAL> &result){
		TPZVec<REAL> v1(3);
		TPZVec<REAL> v2(3);
		TPZVec<REAL> normal(3);
		v1[0]=p1[0]-p2[0];
		v1[1]=p1[1]-p2[1];
		v1[2]=p1[2]-p2[2];
		v2[0]=p2[0]-p3[0];
		v2[1]=p2[1]-p3[1];
		v2[2]=p2[2]-p3[2];
		VectorialProduct(v1,v2,normal);
		VectorialProduct(v1,normal,result);	
	}